

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconstruction.cpp
# Opt level: O1

void lts2::RealReconstructionWithTVL1
               (Mat *x,LBDOperator *LBD,Mat *binaryDescriptor,int iterations,float lambda,
               Size patchSize,float patchMean)

{
  _InputArray *p_Var1;
  int iVar2;
  float fVar3;
  uint in_XMM0_Db;
  uint in_XMM0_Dc;
  uint in_XMM0_Dd;
  float fVar4;
  Mat u_n;
  Mat Au;
  Mat u_;
  Mat q;
  Mat p2;
  Mat p1;
  Mat divP;
  Mat Du1;
  Mat u_nm1;
  Mat Du2;
  _OutputArray local_750;
  double local_738;
  double local_730;
  Mat *local_728;
  LBDOperator *local_720;
  float local_714;
  Mat *local_710;
  Mat *local_708;
  Mat *local_700;
  float local_6f8;
  uint uStack_6f4;
  uint uStack_6f0;
  uint uStack_6ec;
  long *local_6e8;
  _InputArray *p_Stack_6e0;
  Size local_6d8;
  undefined8 uStack_6d0;
  Mat local_678 [96];
  Mat aMStack_618 [144];
  _InputArray local_588 [4];
  float local_528;
  uint uStack_524;
  uint uStack_520;
  uint uStack_51c;
  ulong local_510;
  ulong local_508;
  ulong local_500;
  ulong local_4f8;
  undefined1 local_4f0 [16];
  Size local_4e0;
  Mat local_480 [96];
  Mat aMStack_420 [144];
  _InputArray local_390 [4];
  Mat local_330 [64];
  ulong *local_2f0;
  _InputArray local_2d0 [4];
  _InputArray local_270 [4];
  _InputArray local_210 [4];
  _InputArray local_1b0 [4];
  _OutputArray local_150 [4];
  Mat local_f0 [96];
  Mat local_90 [96];
  
  fVar4 = (LBD->super_LinearOperator)._norm;
  fVar4 = fVar4 * fVar4 + 8.0;
  fVar3 = SQRT(fVar4);
  local_730 = (double)CONCAT44(local_730._4_4_,fVar3);
  local_728 = binaryDescriptor;
  local_720 = LBD;
  local_714 = patchMean;
  local_710 = x;
  local_6f8 = lambda;
  uStack_6f4 = in_XMM0_Db;
  uStack_6f0 = in_XMM0_Dc;
  uStack_6ec = in_XMM0_Dd;
  if (fVar4 < 0.0) {
    local_738 = (double)CONCAT44(local_738._4_4_,fVar4);
    fVar3 = sqrtf(fVar4);
    fVar4 = local_738._0_4_;
  }
  local_738 = (double)CONCAT44(local_738._4_4_,fVar3);
  if (fVar4 < 0.0) {
    fVar4 = sqrtf(fVar4);
    local_730 = (double)CONCAT44(local_730._4_4_,fVar4);
  }
  cv::Mat::Mat(local_330);
  cv::Mat::Mat((Mat *)local_390);
  cv::Mat::Mat((Mat *)local_588);
  cv::Mat::Mat(local_f0);
  cv::Mat::Mat((Mat *)local_150);
  cv::Mat::Mat(local_90);
  cv::Mat::Mat((Mat *)local_210);
  cv::Mat::Mat((Mat *)local_270);
  cv::Mat::Mat((Mat *)local_1b0);
  cv::Mat::Mat((Mat *)local_2d0);
  local_4f8 = **(ulong **)(local_728 + 0x40) << 0x20 | **(ulong **)(local_728 + 0x40) >> 0x20;
  cv::Mat::create(local_390,&local_4f8,5);
  local_6d8.width = 0;
  local_6d8.height = 0;
  uStack_6d0 = 0;
  local_6e8 = (long *)0x0;
  p_Stack_6e0 = (_InputArray *)0x0;
  local_4f0._0_4_ = -0x3efdfffa;
  local_4e0 = (Size)&DAT_400000001;
  local_4f0._8_8_ = (_InputArray *)&local_6e8;
  cv::noArray();
  cv::Mat::setTo(local_390,(_InputArray *)local_4f0);
  if (*(long *)(local_710 + 0x10) == 0) {
    (*(local_720->super_LinearOperator)._vptr_LinearOperator[3])(local_720,local_728,local_588);
    local_6d8.width = 0;
    local_6d8.height = 0;
    uStack_6d0 = 0;
    local_6e8 = (long *)0x0;
    p_Stack_6e0 = (_InputArray *)0x0;
    local_4f0._0_4_ = -0x3efdfffa;
    local_4e0 = (Size)&DAT_400000001;
    local_4f0._8_8_ = (_InputArray *)&local_6e8;
    cv::noArray();
    cv::Mat::setTo(local_588,(_InputArray *)local_4f0);
  }
  else {
    local_6d8.width = 0;
    local_6d8.height = 0;
    local_6e8 = (long *)CONCAT44(local_6e8._4_4_,0x2010000);
    p_Stack_6e0 = local_588;
    cv::Mat::copyTo((_OutputArray *)local_710);
  }
  local_6d8.width = 0;
  local_6d8.height = 0;
  local_6e8 = (long *)CONCAT44(local_6e8._4_4_,0x2010000);
  p_Stack_6e0 = (_InputArray *)local_330;
  cv::Mat::copyTo((_OutputArray *)local_588);
  local_500 = *local_2f0 << 0x20 | *local_2f0 >> 0x20;
  cv::Mat::create(local_210,&local_500,5);
  local_6d8.width = 0;
  local_6d8.height = 0;
  uStack_6d0 = 0;
  local_6e8 = (long *)0x0;
  p_Stack_6e0 = (_InputArray *)0x0;
  local_4f0._0_4_ = -0x3efdfffa;
  local_4e0 = (Size)&DAT_400000001;
  local_4f0._8_8_ = (_InputArray *)&local_6e8;
  cv::noArray();
  cv::Mat::setTo(local_210,(_InputArray *)local_4f0);
  local_508 = *local_2f0 << 0x20 | *local_2f0 >> 0x20;
  cv::Mat::create(local_270,&local_508,5);
  local_6d8.width = 0;
  local_6d8.height = 0;
  uStack_6d0 = 0;
  local_6e8 = (long *)0x0;
  p_Stack_6e0 = (_InputArray *)0x0;
  local_4f0._0_4_ = -0x3efdfffa;
  local_4e0 = (Size)&DAT_400000001;
  local_4f0._8_8_ = (_InputArray *)&local_6e8;
  cv::noArray();
  cv::Mat::setTo(local_270,(_InputArray *)local_4f0);
  local_510 = **(ulong **)(local_728 + 0x40) << 0x20 | **(ulong **)(local_728 + 0x40) >> 0x20;
  cv::Mat::create(local_2d0,&local_510,5);
  local_6d8.width = 0;
  local_6d8.height = 0;
  uStack_6d0 = 0;
  local_6e8 = (long *)0x0;
  p_Stack_6e0 = (_InputArray *)0x0;
  local_4f0._0_4_ = -0x3efdfffa;
  local_4e0 = (Size)&DAT_400000001;
  local_4f0._8_8_ = (_InputArray *)&local_6e8;
  cv::noArray();
  cv::Mat::setTo(local_2d0,(_InputArray *)local_4f0);
  if (0 < iterations) {
    local_730 = (double)(1.0 / local_730._0_4_);
    local_528 = -local_6f8;
    uStack_524 = uStack_6f4 ^ 0x80000000;
    uStack_520 = uStack_6f0 ^ 0x80000000;
    uStack_51c = uStack_6ec ^ 0x80000000;
    local_738 = (double)(1.0 / local_738._0_4_);
    local_708 = aMStack_618;
    local_700 = aMStack_420;
    do {
      HorizontalGradientWithForwardScheme(local_330,(Mat *)local_150);
      local_6d8.width = 0;
      local_6d8.height = 0;
      local_6e8._0_4_ = 0x2010000;
      iVar2 = (int)(_InputArray *)&local_6e8;
      p_Stack_6e0 = &local_150[0].super__InputArray;
      cv::Mat::convertTo(local_150,iVar2,local_730,0.0);
      local_6d8.width = 0;
      local_6d8.height = 0;
      local_6e8._0_4_ = 0x1010000;
      local_750.super__InputArray.obj = local_210;
      local_4e0.width = 0;
      local_4e0.height = 0;
      local_4f0._0_4_ = 0x1010000;
      local_750.super__InputArray.sz.width = 0;
      local_750.super__InputArray.sz.height = 0;
      local_750.super__InputArray.flags = -0x3dff0000;
      p_Stack_6e0 = (_InputArray *)local_750.super__InputArray.obj;
      local_4f0._8_8_ = local_150;
      p_Var1 = (_InputArray *)cv::noArray();
      cv::add((_InputArray *)&local_6e8,(_InputArray *)local_4f0,&local_750,p_Var1,-1);
      VerticalGradientWithForwardScheme(local_330,local_90);
      local_6d8.width = 0;
      local_6d8.height = 0;
      local_6e8._0_4_ = 0x2010000;
      p_Stack_6e0 = (_InputArray *)local_90;
      cv::Mat::convertTo((_OutputArray *)local_90,iVar2,local_730,0.0);
      local_6d8.width = 0;
      local_6d8.height = 0;
      local_6e8._0_4_ = 0x1010000;
      local_750.super__InputArray.obj = local_270;
      local_4e0.width = 0;
      local_4e0.height = 0;
      local_4f0._0_4_ = 0x1010000;
      local_750.super__InputArray.sz.width = 0;
      local_750.super__InputArray.sz.height = 0;
      local_750.super__InputArray.flags = -0x3dff0000;
      p_Stack_6e0 = (_InputArray *)local_750.super__InputArray.obj;
      local_4f0._8_8_ = local_90;
      p_Var1 = (_InputArray *)cv::noArray();
      cv::add((_InputArray *)&local_6e8,(_InputArray *)local_4f0,&local_750,p_Var1,-1);
      ProxL2UnitBall((Mat *)local_210,(Mat *)local_270);
      (*(local_720->super_LinearOperator)._vptr_LinearOperator[2])(local_720,local_330,local_390);
      local_6d8.width = 0;
      local_6d8.height = 0;
      local_6e8._0_4_ = 0x1010000;
      local_750.super__InputArray.obj = local_390;
      local_4e0.width = 0;
      local_4e0.height = 0;
      local_4f0._0_4_ = 0x1010000;
      local_4f0._8_8_ = local_728;
      local_750.super__InputArray.sz.width = 0;
      local_750.super__InputArray.sz.height = 0;
      local_750.super__InputArray.flags = -0x3dff0000;
      p_Stack_6e0 = (_InputArray *)local_750.super__InputArray.obj;
      p_Var1 = (_InputArray *)cv::noArray();
      cv::subtract((_InputArray *)&local_6e8,(_InputArray *)local_4f0,&local_750,p_Var1,-1);
      local_6d8.width = 0;
      local_6d8.height = 0;
      local_6e8._0_4_ = 0x2010000;
      p_Stack_6e0 = local_390;
      cv::Mat::convertTo((_OutputArray *)local_390,iVar2,local_730,0.0);
      local_6d8.width = 0;
      local_6d8.height = 0;
      local_6e8._0_4_ = 0x1010000;
      local_750.super__InputArray.obj = local_2d0;
      local_4e0.width = 0;
      local_4e0.height = 0;
      local_4f0._0_4_ = 0x1010000;
      local_750.super__InputArray.sz.width = 0;
      local_750.super__InputArray.sz.height = 0;
      local_750.super__InputArray.flags = -0x3dff0000;
      p_Stack_6e0 = (_InputArray *)local_750.super__InputArray.obj;
      local_4f0._8_8_ = local_390;
      p_Var1 = (_InputArray *)cv::noArray();
      cv::add((_InputArray *)&local_6e8,(_InputArray *)local_4f0,&local_750,p_Var1,-1);
      ProxRangeConstraint((Mat *)local_2d0,local_528,local_6f8);
      local_6d8.width = 0;
      local_6d8.height = 0;
      local_6e8._0_4_ = 0x2010000;
      p_Stack_6e0 = (_InputArray *)local_f0;
      cv::Mat::copyTo((_OutputArray *)local_588);
      DivergenceWithBackwardScheme((Mat *)local_210,(Mat *)local_270,(Mat *)local_1b0);
      local_6d8.width = 0;
      local_6d8.height = 0;
      local_6e8._0_4_ = 0x2010000;
      p_Stack_6e0 = local_1b0;
      cv::Mat::convertTo((_OutputArray *)p_Stack_6e0,iVar2,local_738,0.0);
      (*(local_720->super_LinearOperator)._vptr_LinearOperator[3])(local_720,local_2d0,local_390);
      local_6d8.width = 0;
      local_6d8.height = 0;
      local_6e8._0_4_ = 0x2010000;
      p_Stack_6e0 = local_390;
      cv::Mat::convertTo((_OutputArray *)local_390,iVar2,local_738,0.0);
      local_6d8.width = 0;
      local_6d8.height = 0;
      local_6e8._0_4_ = 0x1010000;
      local_750.super__InputArray.obj = local_588;
      local_4e0.width = 0;
      local_4e0.height = 0;
      local_4f0._0_4_ = 0x1010000;
      local_750.super__InputArray.sz.width = 0;
      local_750.super__InputArray.sz.height = 0;
      local_750.super__InputArray.flags = -0x3dff0000;
      p_Stack_6e0 = (_InputArray *)local_750.super__InputArray.obj;
      local_4f0._8_8_ = local_390;
      p_Var1 = (_InputArray *)cv::noArray();
      cv::subtract((_InputArray *)&local_6e8,(_InputArray *)local_4f0,&local_750,p_Var1,-1);
      local_6d8.width = 0;
      local_6d8.height = 0;
      local_6e8 = (long *)CONCAT44(local_6e8._4_4_,0x1010000);
      local_750.super__InputArray.obj = local_588;
      local_4e0.width = 0;
      local_4e0.height = 0;
      local_4f0._0_4_ = 0x1010000;
      local_4f0._8_8_ = local_1b0;
      local_750.super__InputArray.sz.width = 0;
      local_750.super__InputArray.sz.height = 0;
      local_750.super__InputArray.flags = -0x3dff0000;
      p_Stack_6e0 = (_InputArray *)local_750.super__InputArray.obj;
      p_Var1 = (_InputArray *)cv::noArray();
      cv::add((_InputArray *)&local_6e8,(_InputArray *)local_4f0,&local_750,p_Var1,-1);
      if ((local_588[0].flags._1_1_ & 0x40) == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"OOOOOOPS, things can go wild...",0x1f);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'x');
        std::ostream::put('x');
        std::ostream::flush();
      }
      ProxMeanConstraint((Mat *)local_588,local_714);
      ProxRangeConstraint((Mat *)local_588,0.0,1.0);
      cv::operator*(2.0,(Mat *)local_4f0);
      cv::operator-((MatExpr *)&local_6e8,(Mat *)local_4f0);
      (**(code **)(*local_6e8 + 0x18))(local_6e8,(_InputArray *)&local_6e8,local_330,0xffffffff);
      cv::Mat::~Mat(local_708);
      cv::Mat::~Mat(local_678);
      cv::Mat::~Mat((Mat *)&local_6d8);
      cv::Mat::~Mat(local_700);
      cv::Mat::~Mat(local_480);
      cv::Mat::~Mat((Mat *)&((_InputArray *)local_4f0)->sz);
      iterations = iterations + -1;
    } while (iterations != 0);
  }
  local_6d8.width = 0;
  local_6d8.height = 0;
  local_6e8 = (long *)CONCAT44(local_6e8._4_4_,0x2010000);
  p_Stack_6e0 = (_InputArray *)local_710;
  cv::Mat::copyTo((_OutputArray *)local_588);
  cv::Mat::~Mat((Mat *)local_2d0);
  cv::Mat::~Mat((Mat *)local_1b0);
  cv::Mat::~Mat((Mat *)local_270);
  cv::Mat::~Mat((Mat *)local_210);
  cv::Mat::~Mat(local_90);
  cv::Mat::~Mat((Mat *)local_150);
  cv::Mat::~Mat(local_f0);
  cv::Mat::~Mat((Mat *)local_588);
  cv::Mat::~Mat((Mat *)local_390);
  cv::Mat::~Mat(local_330);
  return;
}

Assistant:

void lts2::RealReconstructionWithTVL1(cv::Mat &x, LBDOperator &LBD, cv::Mat const &binaryDescriptor,
                                     int iterations, float lambda, cv::Size patchSize, float patchMean)
{
  // Numerical parameters
  float L2 = 8.0f + LBD.norm() * LBD.norm();    // 8 is for TV
  float tau = 1.0f / std::sqrt(L2);   // L^2 * tau * sigma = 1
  float sigma = 1.0f / std::sqrt(L2); // L^2 * tau * sigma = 1

  // Auxiliary variables
  cv::Mat u_, Au, u_n, u_nm1, Du1, Du2;
  cv::Mat p1, p2, divP;       // Dual variables for TV
  cv::Mat q;                  // Dual variable for A

  // We observe g, hence g and Au have the same dimensions
  Au.create(binaryDescriptor.size(), CV_32F);
  Au.setTo(cv::Scalar(0));

  // The size of u may not be the same as the size of g (e.g. A is a projection)
  // so we guess the size of u either from a non-zero input, or from the application
  // of A^t.
  if (x.data)
    x.copyTo(u_n);
  else
  {
    LBD.ApplyConjugate(binaryDescriptor, u_n);
    u_n.setTo(cv::Scalar(0));
  }

  u_n.copyTo(u_);

  p1.create(u_.size(), CV_32FC1);
  p1.setTo(cv::Scalar(0));
  p2.create(u_.size(), CV_32FC1);
  p2.setTo(cv::Scalar(0));

  q.create(binaryDescriptor.size(), CV_32F);
  q.setTo(cv::Scalar(0));

  // Main loop
  for (int i = 0; i < iterations; ++i)
  {
    //-------------------------------
    // Solve the dual (F^\star, K)
    //-------------------------------

    // K = (\nabla, A)
    // Apply K to U_, add to the dual variable

    // First part: TV
    lts2::HorizontalGradientWithForwardScheme(u_, Du1);
    Du1 *= sigma;
    p1 += Du1;

    lts2::VerticalGradientWithForwardScheme(u_, Du2);
    Du2 *= sigma;
    p2 += Du2;

    lts2::ProxL2UnitBall(p1, p2);

    // Second part: Au
    LBD.Apply(u_, Au);
    Au -= binaryDescriptor;
    Au *= sigma;
    q += Au;
    lts2::ProxRangeConstraint(q, -lambda, lambda);

    // Compute the prox

    //-------------------------------
    // Solve the primal (G, K^\star)
    //-------------------------------

    // Save the current estimate
    u_n.copyTo(u_nm1);

    // Apply K^\star to the dual variable
    // TV
    lts2::DivergenceWithBackwardScheme(p1, p2, divP);
    divP *= tau;

    // Operator A
    LBD.ApplyConjugate(q, Au);
    Au *= tau;

    // Solve the prox                                                                                                                                                   
    u_n -= Au;
    u_n += divP;

    // Enforce the range of the data [0, 1] and the mean
    if (!u_n.isContinuous())
      std::cerr << "OOOOOOPS, things can go wild..." << std::endl;

    lts2::ProxMeanConstraint(u_n, patchMean);
    lts2::ProxRangeConstraint(u_n, 0.0, 1.0);

    //-------------------------------
    // Next iteration
    //-------------------------------
    u_ = 2.0f * u_n - u_nm1;
  }

  u_n.copyTo(x);
}